

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dma_write.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ssize_t sVar2;
  char **in_RSI;
  int in_EDI;
  char buf [4096];
  uint16_t devn;
  uint16_t busn;
  uintptr_t addr;
  nettlp nt;
  int mps;
  int size;
  int ch;
  int ret;
  nettlp *in_stack_ffffffffffffefa8;
  char local_1048 [32];
  size_t in_stack_ffffffffffffefd8;
  size_t in_stack_ffffffffffffefe0;
  void *in_stack_ffffffffffffefe8;
  uintptr_t in_stack_ffffffffffffeff0;
  nettlp *in_stack_ffffffffffffeff8;
  size_t in_stack_fffffffffffff030;
  void *in_stack_fffffffffffff038;
  uintptr_t in_stack_fffffffffffff040;
  nettlp *in_stack_fffffffffffff048;
  ushort local_44;
  short local_42;
  undefined8 local_40;
  undefined1 local_38 [4];
  undefined1 auStack_34 [4];
  ushort local_30;
  undefined1 local_2e;
  int local_20;
  uint local_1c;
  int local_18;
  uint local_14;
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(local_38,0,0x18);
  local_40 = 0;
  local_42 = 0;
  local_44 = 0;
  local_20 = 0;
  local_1c = 0;
  do {
    local_18 = getopt(local_8,local_10,"r:l:b:t:a:s:p:m:");
    if (local_18 == -1) {
      local_14 = nettlp_init(in_stack_ffffffffffffefa8);
      if ((int)local_14 < 0) {
        perror("nettlp_init");
        return local_14;
      }
      dump_nettlp((nettlp *)0x102801);
      printf("start DMA write, to 0x%lx, payload=\'%s\', size %d-byte\n",local_40,local_1048,
             (ulong)local_1c);
      if (local_20 == 0) {
        sVar2 = dma_write(in_stack_fffffffffffff048,in_stack_fffffffffffff040,
                          in_stack_fffffffffffff038,in_stack_fffffffffffff030);
        local_14 = (uint)sVar2;
      }
      else {
        sVar2 = dma_write_aligned(in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
                                  in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                                  in_stack_ffffffffffffefd8);
        local_14 = (uint)sVar2;
      }
      printf("dma_write to 0x%lx returns %d\n",local_40,(ulong)local_14);
      if ((int)local_14 < 0) {
        perror("dma_read");
      }
      return 0;
    }
    switch(local_18) {
    case 0x61:
      local_14 = __isoc99_sscanf(_optarg,"0x%lx",&local_40);
      break;
    case 0x62:
      local_14 = __isoc99_sscanf(_optarg,"%hx:%hx",&local_42,&local_44);
      local_30 = local_42 << 8 | local_44;
      break;
    default:
      usage();
      return -1;
    case 0x6c:
      local_14 = inet_pton(2,_optarg,auStack_34);
      if ((int)local_14 < 1) {
        perror("inet_pton");
        return -1;
      }
      break;
    case 0x6d:
      local_20 = atoi(_optarg);
      break;
    case 0x70:
      strncpy(local_1048,_optarg,0x1000);
      break;
    case 0x72:
      local_14 = inet_pton(2,_optarg,local_38);
      if ((int)local_14 < 1) {
        perror("inet_pton");
        return -1;
      }
      break;
    case 0x73:
      local_1c = atoi(_optarg);
      if (0x1000 < (int)local_1c) {
        fprintf(_stderr,"too large size\n");
        return -1;
      }
      break;
    case 0x74:
      iVar1 = atoi(_optarg);
      local_2e = (undefined1)iVar1;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch, size, mps;
	struct nettlp nt;
	uintptr_t addr;
	uint16_t busn, devn;
	char buf[4096];

	memset(&nt, 0, sizeof(nt));
	addr = 0;
	busn = 0;
	devn = 0;
	mps = 0;

	size = 0;

	while ((ch = getopt(argc, argv, "r:l:b:t:a:s:p:m:")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &nt.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &nt.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'b':
			ret = sscanf(optarg, "%hx:%hx", &busn, &devn);
			nt.requester = (busn << 8 | devn);
			break;

		case 't':
			nt.tag = atoi(optarg);
			break;

		case 'a':
			ret = sscanf(optarg, "0x%lx", &addr);
			break;

		case 'p':
			strncpy(buf, optarg, sizeof(buf));
			break;

		case 's':
			size = atoi(optarg);
			if (size > 4096) {
				fprintf(stderr, "too large size\n");
				return -1;
			}
			break;

		case 'm':
			mps = atoi(optarg);
			break;

		default :
			usage();
			return -1;
		}
	}

	ret = nettlp_init(&nt);
	if (ret < 0) {
		perror("nettlp_init");
		return ret;
	}
	dump_nettlp(&nt);

	printf("start DMA write, to 0x%lx, payload='%s', size %d-byte\n",
	       addr, buf, size);

	if (mps)
		ret = dma_write_aligned(&nt, addr, buf, size, mps);
	else
		ret = dma_write(&nt, addr, buf, size);

	printf("dma_write to 0x%lx returns %d\n", addr, ret);

	if (ret < 0)
		perror("dma_read");


	return 0;
}